

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-death-test.cc
# Opt level: O3

void __thiscall testing::internal::DeathTestImpl::~DeathTestImpl(DeathTestImpl *this)

{
  bool bVar1;
  long *plVar2;
  long *plVar3;
  size_type *psVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  string local_d8;
  undefined1 *local_b8 [2];
  undefined1 local_a8 [16];
  string local_98;
  long *local_78;
  long local_70;
  long local_68;
  long lStack_60;
  long *local_58;
  long local_50;
  long local_48;
  long lStack_40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  int local_14;
  
  (this->super_DeathTest)._vptr_DeathTest = (_func_int **)&PTR__DeathTestImpl_00151aa0;
  do {
    bVar1 = IsTrue(this->read_fd_ == -1);
    if (!bVar1) {
      local_b8[0] = local_a8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"CHECK failed: File ","");
      plVar2 = (long *)std::__cxx11::string::append((char *)local_b8);
      local_58 = (long *)*plVar2;
      plVar3 = plVar2 + 2;
      if (local_58 == plVar3) {
        local_48 = *plVar3;
        lStack_40 = plVar2[3];
        local_58 = &local_48;
      }
      else {
        local_48 = *plVar3;
      }
      local_50 = plVar2[1];
      *plVar2 = (long)plVar3;
      plVar2[1] = 0;
      *(undefined1 *)(plVar2 + 2) = 0;
      plVar2 = (long *)std::__cxx11::string::append((char *)&local_58);
      local_38._M_dataplus._M_p = (pointer)*plVar2;
      psVar4 = (size_type *)(plVar2 + 2);
      if ((size_type *)local_38._M_dataplus._M_p == psVar4) {
        local_38.field_2._M_allocated_capacity = *psVar4;
        local_38.field_2._8_8_ = plVar2[3];
        local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
      }
      else {
        local_38.field_2._M_allocated_capacity = *psVar4;
      }
      local_38._M_string_length = plVar2[1];
      *plVar2 = (long)psVar4;
      plVar2[1] = 0;
      *(undefined1 *)(plVar2 + 2) = 0;
      local_14 = 0x1a2;
      StreamableToString<int>(&local_d8,&local_14);
      std::operator+(&local_f8,&local_38,&local_d8);
      plVar2 = (long *)std::__cxx11::string::append((char *)&local_f8);
      local_78 = (long *)*plVar2;
      plVar3 = plVar2 + 2;
      if (local_78 == plVar3) {
        local_68 = *plVar3;
        lStack_60 = plVar2[3];
        local_78 = &local_68;
      }
      else {
        local_68 = *plVar3;
      }
      local_70 = plVar2[1];
      *plVar2 = (long)plVar3;
      plVar2[1] = 0;
      *(undefined1 *)(plVar2 + 2) = 0;
      plVar2 = (long *)std::__cxx11::string::append((char *)&local_78);
      local_98._M_dataplus._M_p = (pointer)*plVar2;
      psVar4 = (size_type *)(plVar2 + 2);
      if ((size_type *)local_98._M_dataplus._M_p == psVar4) {
        local_98.field_2._M_allocated_capacity = *psVar4;
        local_98.field_2._8_8_ = plVar2[3];
        local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
      }
      else {
        local_98.field_2._M_allocated_capacity = *psVar4;
      }
      local_98._M_string_length = plVar2[1];
      *plVar2 = (long)psVar4;
      plVar2[1] = 0;
      *(undefined1 *)(plVar2 + 2) = 0;
      DeathTestAbort(&local_98);
    }
    bVar1 = AlwaysTrue();
  } while (!bVar1);
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ::~MatcherBase(&(this->matcher_).
                  super_MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                );
  return;
}

Assistant:

~DeathTestImpl() override { GTEST_DEATH_TEST_CHECK_(read_fd_ == -1); }